

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  long lVar7;
  long lVar8;
  ImGuiContext *g;
  ImRect IVar9;
  
  pIVar3 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar5 = GImGui->NavWindow, pIVar5 == (ImGuiWindow *)0x0 || (pIVar5->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar6 = GImGui->HoveredWindow;
      if ((pIVar6 == (ImGuiWindow *)0x0) || (this = pIVar6->RootWindow, this == (ImGuiWindow *)0x0))
      {
        if ((pIVar5 != (ImGuiWindow *)0x0) &&
           (pIVar5 = GetTopMostPopupModal(), pIVar5 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else if ((this->Flags & 0x4000000) == 0) {
LAB_001e3ef1:
        StartMouseMovingWindow(pIVar6);
        if (((pIVar3->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((this->Flags & 1) == 0)) {
          IVar9 = ImGuiWindow::TitleBarRect(this);
          fVar1 = (pIVar3->IO).MouseClickedPos[0].x;
          if ((fVar1 < IVar9.Min.x) ||
             (((fVar2 = (pIVar3->IO).MouseClickedPos[0].y, fVar2 < IVar9.Min.y ||
               (IVar9.Max.x <= fVar1)) || (IVar9.Max.y <= fVar2)))) {
            pIVar3->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar3->HoveredIdDisabled == true) {
          pIVar3->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
      else {
        lVar7 = (long)(GImGui->OpenPopupStack).Size;
        if (0 < lVar7) {
          lVar8 = 0;
          do {
            if (*(ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar8) ==
                this->PopupId) goto LAB_001e3ef1;
            lVar8 = lVar8 + 0x38;
          } while (lVar7 * 0x38 - lVar8 != 0);
        }
      }
    }
    if ((pIVar3->IO).MouseClicked[1] == true) {
      pIVar6 = GetTopMostPopupModal();
      pIVar5 = pIVar3->HoveredWindow;
      if ((pIVar5 != (ImGuiWindow *)0x0) &&
         ((pIVar6 == (ImGuiWindow *)0x0 || (bVar4 = IsWindowAbove(pIVar5,pIVar6), bVar4)))) {
        pIVar6 = pIVar5;
      }
      ClosePopupsOverWindow(pIVar6,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && (modal == NULL || IsWindowAbove(g.HoveredWindow, modal));
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}